

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir.h
# Opt level: O0

void __thiscall wabt::FuncDeclaration::FuncDeclaration(FuncDeclaration *this)

{
  Location local_30;
  FuncDeclaration *local_10;
  FuncDeclaration *this_local;
  
  this->has_func_type = false;
  local_10 = this;
  Location::Location(&local_30);
  Var::Var(&this->type_var,0xffffffff,&local_30);
  FuncSignature::FuncSignature(&this->sig);
  return;
}

Assistant:

Type GetParamType(Index index) const { return sig.GetParamType(index); }